

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall GlobOpt::InsertToVarAtDefInTryRegion(GlobOpt *this,Instr *instr,Opnd *dstOpnd)

{
  RegionType RVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  BOOLEAN BVar5;
  undefined4 *puVar6;
  StackSym *sym;
  RegOpnd *regOpnd;
  
  RVar1 = this->currentRegion->type;
  if ((RVar1 == RegionTypeFinally) || (RVar1 == RegionTypeTry)) {
    OVar3 = IR::Opnd::GetKind(dstOpnd);
    if (OVar3 != OpndKindReg) {
      return;
    }
    OVar3 = IR::Opnd::GetKind(dstOpnd);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_00452f92;
      *puVar6 = 0;
    }
    if ((*(byte *)((long)dstOpnd[1]._vptr_Opnd + 0x19) & 0x20) == 0) {
      return;
    }
    OVar3 = IR::Opnd::GetKind(dstOpnd);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) {
LAB_00452f92:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    if (((StackSym *)dstOpnd[1]._vptr_Opnd)->m_type == TyVar) {
      return;
    }
    sym = StackSym::GetVarEquivSym((StackSym *)dstOpnd[1]._vptr_Opnd,(Func *)0x0);
    if (((this->currentRegion->type == RegionTypeTry) &&
        (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                           (this->currentRegion->writeThroughSymbolsSet,(sym->super_Sym).m_id),
        BVar5 != '\0')) ||
       ((this->currentRegion->type == RegionTypeFinally &&
        (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                           (this->currentRegion->matchingTryRegion->writeThroughSymbolsSet,
                            (sym->super_Sym).m_id), BVar5 != '\0')))) {
      regOpnd = IR::RegOpnd::New(sym,TyVar,instr->m_func);
      ToVar(this,instr->m_next,regOpnd,this->currentBlock,(Value *)0x0,false);
      return;
    }
  }
  return;
}

Assistant:

void
GlobOpt::InsertToVarAtDefInTryRegion(IR::Instr * instr, IR::Opnd * dstOpnd)
{
    if ((this->currentRegion->GetType() == RegionTypeTry || this->currentRegion->GetType() == RegionTypeFinally) &&
        dstOpnd->IsRegOpnd() && dstOpnd->AsRegOpnd()->m_sym->HasByteCodeRegSlot())
    {
        StackSym * sym = dstOpnd->AsRegOpnd()->m_sym;
        if (sym->IsVar())
        {
            return;
        }

        StackSym * varSym = sym->GetVarEquivSym(nullptr);
        if ((this->currentRegion->GetType() == RegionTypeTry && this->currentRegion->writeThroughSymbolsSet->Test(varSym->m_id)) ||
            ((this->currentRegion->GetType() == RegionTypeFinally && this->currentRegion->GetMatchingTryRegion()->writeThroughSymbolsSet->Test(varSym->m_id))))
        {
            IR::RegOpnd * regOpnd = IR::RegOpnd::New(varSym, IRType::TyVar, instr->m_func);
            this->ToVar(instr->m_next, regOpnd, this->currentBlock, NULL, false);
        }
    }
}